

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

int toktlsea(toktdef *tab1,char *name,int namel,int hash,toksdef *ret)

{
  int iVar1;
  size_t sVar2;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  void *in_R8;
  toktldef *tab;
  uint cnt;
  toksdef *p;
  int local_34;
  void *local_30;
  
  local_30 = *(void **)(in_RDI + 0x30);
  local_34 = *(int *)(in_RDI + 0x40);
  while( true ) {
    if (local_34 == 0) {
      return 0;
    }
    if ((*(byte *)((long)local_30 + 6) == in_EDX) &&
       (iVar1 = memcmp((void *)((long)local_30 + 7),in_RSI,(long)(int)in_EDX), iVar1 == 0)) break;
    sVar2 = osrndsz((ulong)*(byte *)((long)local_30 + 6) + 8);
    local_30 = (void *)((long)local_30 + sVar2);
    local_34 = local_34 + -1;
  }
  memcpy(in_R8,local_30,(long)(int)in_EDX + 8);
  return 1;
}

Assistant:

int toktlsea(toktdef *tab1, char *name, int namel, int hash, toksdef *ret)
{
    toksdef  *p;
    uint      cnt;
    toktldef *tab = (toktldef *)tab1;
    
    VARUSED(hash);
    
    for (p = (toksdef *)tab->toktlptr, cnt = tab->toktlcnt ; cnt ; --cnt )
    {
        if (p->tokslen == namel && !memcmp(p->toksnam, name, (size_t)namel))
        {
            memcpy(ret, p, (size_t)(sizeof(toks1def) + namel));
            return(TRUE);
        }
        
        p = (toksdef *)(((uchar *)p)
                        + osrndsz(p->tokslen + sizeof(toks1def)));
    }

    /* nothing found - indicate by returning FALSE */
    return(FALSE);
}